

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stagewise_poly.cc
# Opt level: O2

base_learner * stagewise_poly_setup(options_i *options,vw *all)

{
  undefined8 uVar1;
  undefined8 uVar2;
  option_group_definition *poVar3;
  typed_option<float> *ptVar4;
  typed_option<unsigned_int> *ptVar5;
  base_learner *l;
  single_learner *base;
  learner<stagewise_poly,_example> *plVar6;
  bool stage_poly;
  free_ptr<stagewise_poly> poly;
  option_group_definition new_options;
  bool local_691;
  allocator local_690;
  allocator local_68f;
  allocator local_68e;
  allocator local_68d;
  allocator local_68c;
  allocator local_68b;
  allocator local_68a;
  allocator local_689;
  free_ptr<stagewise_poly> local_688;
  string local_678 [32];
  string local_658;
  string local_638 [32];
  string local_618;
  string local_5f8 [32];
  string local_5d8;
  string local_5b8 [32];
  string local_598;
  string local_578;
  option_group_definition local_558;
  undefined1 local_520 [112];
  bool local_4b0;
  undefined1 local_480 [160];
  typed_option<bool> local_3e0;
  typed_option<unsigned_int> local_340;
  typed_option<unsigned_int> local_2a0;
  typed_option<float> local_200;
  typed_option<float> local_160;
  typed_option<bool> local_c0;
  
  scoped_calloc_or_throw<stagewise_poly>();
  local_691 = false;
  std::__cxx11::string::string
            ((string *)&local_578,"Stagewise polynomial options",(allocator *)local_520);
  VW::config::option_group_definition::option_group_definition(&local_558,&local_578);
  std::__cxx11::string::~string((string *)&local_578);
  std::__cxx11::string::string((string *)&local_598,"stage_poly",&local_689);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_520,&local_598,&local_691);
  local_4b0 = true;
  std::__cxx11::string::string(local_5b8,"use stagewise polynomial feature learning",&local_68a);
  std::__cxx11::string::_M_assign((string *)(local_520 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_c0,(typed_option<bool> *)local_520);
  poVar3 = VW::config::option_group_definition::add<bool>(&local_558,&local_c0);
  std::__cxx11::string::string((string *)&local_5d8,"sched_exponent",&local_68b);
  VW::config::typed_option<float>::typed_option
            (&local_200,&local_5d8,
             &(local_688._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl)->sched_exponent);
  ptVar4 = VW::config::typed_option<float>::default_value(&local_200,1.0);
  std::__cxx11::string::string
            (local_5f8,"exponent controlling quantity of included features",&local_68c);
  std::__cxx11::string::_M_assign((string *)&(ptVar4->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_160,ptVar4);
  poVar3 = VW::config::option_group_definition::add<float>(poVar3,&local_160);
  std::__cxx11::string::string((string *)&local_618,"batch_sz",&local_68d);
  VW::config::typed_option<unsigned_int>::typed_option
            (&local_340,&local_618,
             &(local_688._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl)->batch_sz);
  ptVar5 = VW::config::typed_option<unsigned_int>::default_value(&local_340,1000);
  std::__cxx11::string::string
            (local_638,"multiplier on batch size before including more features",&local_68e);
  std::__cxx11::string::_M_assign((string *)&(ptVar5->super_base_option).m_help);
  VW::config::typed_option<unsigned_int>::typed_option(&local_2a0,ptVar5);
  poVar3 = VW::config::option_group_definition::add<unsigned_int>(poVar3,&local_2a0);
  std::__cxx11::string::string((string *)&local_658,"batch_sz_no_doubling",&local_68f);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_480,&local_658,
             &(local_688._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl)->batch_sz_double);
  std::__cxx11::string::string(local_678,"batch_sz does not double",&local_690);
  std::__cxx11::string::_M_assign((string *)(local_480 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_3e0,(typed_option<bool> *)local_480);
  VW::config::option_group_definition::add<bool>(poVar3,&local_3e0);
  VW::config::typed_option<bool>::~typed_option(&local_3e0);
  std::__cxx11::string::~string(local_678);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_480);
  std::__cxx11::string::~string((string *)&local_658);
  VW::config::typed_option<unsigned_int>::~typed_option(&local_2a0);
  std::__cxx11::string::~string(local_638);
  VW::config::typed_option<unsigned_int>::~typed_option(&local_340);
  std::__cxx11::string::~string((string *)&local_618);
  VW::config::typed_option<float>::~typed_option(&local_160);
  std::__cxx11::string::~string(local_5f8);
  VW::config::typed_option<float>::~typed_option(&local_200);
  std::__cxx11::string::~string((string *)&local_5d8);
  VW::config::typed_option<bool>::~typed_option(&local_c0);
  std::__cxx11::string::~string(local_5b8);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_520);
  std::__cxx11::string::~string((string *)&local_598);
  (**options->_vptr_options_i)(options,&local_558);
  if (local_691 == false) {
    plVar6 = (learner<stagewise_poly,_example> *)0x0;
  }
  else {
    (local_688._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl)->all = all;
    depthsbits_create(local_688._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
                      super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
                      super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl);
    (local_688._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl)->sd = (sort_data *)0x0;
    (local_688._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl)->sd_len = 0;
    (local_688._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl)->batch_sz_double =
         (bool)((local_688._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
                 super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
                 super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl)->batch_sz_double ^ 1);
    (local_688._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl)->sum_sparsity = 0;
    (local_688._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl)->sum_input_sparsity = 0;
    (local_688._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl)->num_examples = 0;
    (local_688._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl)->sum_sparsity_sync = 0;
    (local_688._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl)->sum_input_sparsity_sync = 0;
    (local_688._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl)->num_examples_sync = 0;
    (local_688._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl)->last_example_counter =
         0xffffffffffffffff;
    (local_688._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl)->numpasses = 1;
    (local_688._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl)->update_support = false;
    (local_688._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl)->original_ec = (example *)0x0;
    (local_688._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl)->next_batch_sz =
         (local_688._M_t.super___uniq_ptr_impl<stagewise_poly,_void_(*)(void_*)>._M_t.
          super__Tuple_impl<0UL,_stagewise_poly_*,_void_(*)(void_*)>.
          super__Head_base<0UL,_stagewise_poly_*,_false>._M_head_impl)->batch_sz;
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    plVar6 = LEARNER::init_learner<stagewise_poly,example,LEARNER::learner<char,example>>
                       (&local_688,base,learn,predict);
    uVar1 = *(undefined8 *)(plVar6 + 0x18);
    uVar2 = *(undefined8 *)(plVar6 + 0x20);
    *(undefined8 *)(plVar6 + 0xb8) = uVar1;
    *(undefined8 *)(plVar6 + 0xc0) = uVar2;
    *(code **)(plVar6 + 200) = finish;
    *(code **)(plVar6 + 0x80) = save_load;
    *(undefined8 *)(plVar6 + 0x70) = uVar1;
    *(undefined8 *)(plVar6 + 0x78) = uVar2;
    *(undefined8 *)(plVar6 + 0x58) = uVar1;
    *(code **)(plVar6 + 0x68) = finish_example;
    *(undefined8 *)(plVar6 + 0x88) = uVar1;
    *(undefined8 *)(plVar6 + 0x90) = uVar2;
    *(code **)(plVar6 + 0x98) = end_pass;
  }
  VW::config::option_group_definition::~option_group_definition(&local_558);
  std::unique_ptr<stagewise_poly,_void_(*)(void_*)>::~unique_ptr(&local_688);
  return (base_learner *)plVar6;
}

Assistant:

base_learner *stagewise_poly_setup(options_i &options, vw &all)
{
  auto poly = scoped_calloc_or_throw<stagewise_poly>();
  bool stage_poly = false;
  option_group_definition new_options("Stagewise polynomial options");
  new_options.add(make_option("stage_poly", stage_poly).keep().help("use stagewise polynomial feature learning"))
      .add(make_option("sched_exponent", poly->sched_exponent)
               .default_value(1.f)
               .help("exponent controlling quantity of included features"))
      .add(make_option("batch_sz", poly->batch_sz)
               .default_value(1000)
               .help("multiplier on batch size before including more features"))
      .add(make_option("batch_sz_no_doubling", poly->batch_sz_double).help("batch_sz does not double"));
#ifdef MAGIC_ARGUMENT
  new_options.add(
      make_typed_option("magic_argument", poly->magic_argument).default_value(0.).help("magical feature flag"));
#endif  // MAGIC_ARGUMENT
  options.add_and_parse(new_options);

  if (!stage_poly)
    return nullptr;

  poly->all = &all;
  depthsbits_create(*poly.get());
  sort_data_create(*poly.get());

  poly->batch_sz_double = !poly->batch_sz_double;

  poly->sum_sparsity = 0;
  poly->sum_input_sparsity = 0;
  poly->num_examples = 0;
  poly->sum_sparsity_sync = 0;
  poly->sum_input_sparsity_sync = 0;
  poly->num_examples_sync = 0;
  poly->last_example_counter = -1;
  poly->numpasses = 1;
  poly->update_support = false;
  poly->original_ec = nullptr;
  poly->next_batch_sz = poly->batch_sz;

  learner<stagewise_poly, example> &l = init_learner(poly, as_singleline(setup_base(options, all)), learn, predict);
  l.set_finish(finish);
  l.set_save_load(save_load);
  l.set_finish_example(finish_example);
  l.set_end_pass(end_pass);

  return make_base(l);
}